

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

RbuState * rbuLoadState(sqlite3rbu *p)

{
  sqlite3 *db;
  int iVar1;
  u32 uVar2;
  i64 *pzErrmsg;
  char *zSql;
  RbuState *pRVar3;
  bool bVar4;
  u32 local_2c;
  int rc2;
  int rc;
  sqlite3_stmt *pStmt;
  RbuState *pRet;
  sqlite3rbu *p_local;
  
  pStmt = (sqlite3_stmt *)0x0;
  _rc2 = (sqlite3_stmt *)0x0;
  pRet = (RbuState *)p;
  pStmt = (sqlite3_stmt *)rbuMalloc(p,0x50);
  if (pStmt == (sqlite3_stmt *)0x0) {
    p_local = (sqlite3rbu *)0x0;
  }
  else {
    db = (sqlite3 *)pRet->zDataTbl;
    pzErrmsg = &pRet->iOalSz;
    zSql = sqlite3_mprintf("SELECT k, v FROM %s.rbu_state",&pRet->nProgress);
    local_2c = prepareFreeAndCollectError(db,(sqlite3_stmt **)&rc2,(char **)pzErrmsg,zSql);
    while( true ) {
      bVar4 = false;
      if (local_2c == 0) {
        iVar1 = sqlite3_step(_rc2);
        bVar4 = iVar1 == 100;
      }
      if (!bVar4) break;
      iVar1 = sqlite3_column_int(_rc2,0);
      if (iVar1 - 1U < 9 || iVar1 == 10) {
        pRVar3 = (RbuState *)
                 (*(code *)(&DAT_00226e3c + *(int *)(&DAT_00226e3c + (ulong)(iVar1 - 1U) * 4)))();
        return pRVar3;
      }
      local_2c = 0xb;
    }
    uVar2 = sqlite3_finalize(_rc2);
    if (local_2c == 0) {
      local_2c = uVar2;
    }
    pRet->iCookie = local_2c;
    p_local = (sqlite3rbu *)pStmt;
  }
  return (RbuState *)p_local;
}

Assistant:

static RbuState *rbuLoadState(sqlite3rbu *p){
  RbuState *pRet = 0;
  sqlite3_stmt *pStmt = 0;
  int rc;
  int rc2;

  pRet = (RbuState*)rbuMalloc(p, sizeof(RbuState));
  if( pRet==0 ) return 0;

  rc = prepareFreeAndCollectError(p->dbRbu, &pStmt, &p->zErrmsg, 
      sqlite3_mprintf("SELECT k, v FROM %s.rbu_state", p->zStateDb)
  );
  while( rc==SQLITE_OK && SQLITE_ROW==sqlite3_step(pStmt) ){
    switch( sqlite3_column_int(pStmt, 0) ){
      case RBU_STATE_STAGE:
        pRet->eStage = sqlite3_column_int(pStmt, 1);
        if( pRet->eStage!=RBU_STAGE_OAL
         && pRet->eStage!=RBU_STAGE_MOVE
         && pRet->eStage!=RBU_STAGE_CKPT
        ){
          p->rc = SQLITE_CORRUPT;
        }
        break;

      case RBU_STATE_TBL:
        pRet->zTbl = rbuStrndup((char*)sqlite3_column_text(pStmt, 1), &rc);
        break;

      case RBU_STATE_IDX:
        pRet->zIdx = rbuStrndup((char*)sqlite3_column_text(pStmt, 1), &rc);
        break;

      case RBU_STATE_ROW:
        pRet->nRow = sqlite3_column_int(pStmt, 1);
        break;

      case RBU_STATE_PROGRESS:
        pRet->nProgress = sqlite3_column_int64(pStmt, 1);
        break;

      case RBU_STATE_CKPT:
        pRet->iWalCksum = sqlite3_column_int64(pStmt, 1);
        break;

      case RBU_STATE_COOKIE:
        pRet->iCookie = (u32)sqlite3_column_int64(pStmt, 1);
        break;

      case RBU_STATE_OALSZ:
        pRet->iOalSz = (u32)sqlite3_column_int64(pStmt, 1);
        break;

      case RBU_STATE_PHASEONESTEP:
        pRet->nPhaseOneStep = sqlite3_column_int64(pStmt, 1);
        break;

      case RBU_STATE_DATATBL:
        pRet->zDataTbl = rbuStrndup((char*)sqlite3_column_text(pStmt, 1), &rc);
        break;

      default:
        rc = SQLITE_CORRUPT;
        break;
    }
  }
  rc2 = sqlite3_finalize(pStmt);
  if( rc==SQLITE_OK ) rc = rc2;

  p->rc = rc;
  return pRet;
}